

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O2

Option<Kernel::TermList>
Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RealConstantType>>
          (char *ctxt)

{
  MaybeUninit<Kernel::TermList> extraout_RDX;
  Option<Kernel::TermList> OVar1;
  Term *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  char local_28;
  char local_20;
  undefined8 local_18;
  
  NumTraits<Kernel::RealConstantType>::
  ifLinMul<Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Rebalancing::InversionContext_const&,Kernel::NumTraits<Kernel::RealConstantType>)::_lambda(auto:1&,auto:2)_1_>
            (unaff_retaddr,(anon_class_16_2_d7009eb6)in_stack_00000008);
  if (local_28 == '\x01') {
    if (local_20 == '\0') {
      *ctxt = '\0';
    }
    else {
      *ctxt = local_20;
      *(undefined8 *)(ctxt + 8) = local_18;
    }
  }
  else {
    ctxt[0] = '\0';
    ctxt[1] = '\0';
    ctxt[2] = '\0';
    ctxt[3] = '\0';
    ctxt[4] = '\0';
    ctxt[5] = '\0';
    ctxt[6] = '\0';
    ctxt[7] = '\0';
    ctxt[8] = '\0';
    ctxt[9] = '\0';
    ctxt[10] = '\0';
    ctxt[0xb] = '\0';
    ctxt[0xc] = '\0';
    ctxt[0xd] = '\0';
    ctxt[0xe] = '\0';
    ctxt[0xf] = '\0';
  }
  OVar1.super_OptionBase<Kernel::TermList>._elem._elem = extraout_RDX._elem;
  OVar1.super_OptionBase<Kernel::TermList>._0_8_ = ctxt;
  return (Option<Kernel::TermList>)OVar1.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<TermList> tryInvertLinMul(InversionContext const& ctxt, NumTraits n) {
    return asig(n)
      .ifLinMul(&ctxt.topTerm(), [&](auto& c, auto t) { 
          return someIf(c != 0, [&]() { return asig(n).linMul(1/c, ctxt.toWrap()); }); 
      })
      .flatten();
}